

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

UA_StatusCode
addOneWayReference(UA_Server *server,UA_Session *session,UA_Node *node,UA_AddReferencesItem *item)

{
  UA_Byte **ppUVar1;
  UA_ExpandedNodeId *pUVar2;
  UA_ReferenceNode *pUVar3;
  size_t sVar4;
  UA_StatusCode UVar5;
  UA_StatusCode UVar6;
  UA_ReferenceNode *pUVar7;
  
  sVar4 = node->referencesSize;
  pUVar7 = (UA_ReferenceNode *)realloc(node->references,(sVar4 + 1 | 3) * 0x50);
  if (pUVar7 == (UA_ReferenceNode *)0x0) {
    UVar6 = 0x80030000;
  }
  else {
    node->references = pUVar7;
    ppUVar1 = &pUVar7[sVar4].targetId.namespaceUri.data;
    *ppUVar1 = (UA_Byte *)0x0;
    ppUVar1[1] = (UA_Byte *)0x0;
    ppUVar1 = &pUVar7[sVar4].targetId.nodeId.identifier.string.data;
    *ppUVar1 = (UA_Byte *)0x0;
    ppUVar1[1] = (UA_Byte *)0x0;
    pUVar2 = &pUVar7[sVar4].targetId;
    (pUVar2->nodeId).namespaceIndex = 0;
    *(undefined2 *)&(pUVar2->nodeId).field_0x2 = 0;
    (pUVar2->nodeId).identifierType = UA_NODEIDTYPE_NUMERIC;
    (pUVar2->nodeId).identifier.string.length = 0;
    ppUVar1 = &pUVar7[sVar4].referenceTypeId.identifier.string.data;
    *ppUVar1 = (UA_Byte *)0x0;
    ppUVar1[1] = (UA_Byte *)0x0;
    pUVar3 = pUVar7 + sVar4;
    (pUVar3->referenceTypeId).namespaceIndex = 0;
    *(undefined2 *)&(pUVar3->referenceTypeId).field_0x2 = 0;
    (pUVar3->referenceTypeId).identifierType = UA_NODEIDTYPE_NUMERIC;
    (pUVar3->referenceTypeId).identifier.string.length = 0;
    UVar5 = UA_NodeId_copy(&item->referenceTypeId,&pUVar7[sVar4].referenceTypeId);
    UVar6 = UA_ExpandedNodeId_copy(&item->targetNodeId,&pUVar7[sVar4].targetId);
    UVar6 = UVar6 | UVar5;
    pUVar7[sVar4].isInverse = (UA_Boolean)(item->isForward ^ 1);
    if (UVar6 == 0) {
      node->referencesSize = sVar4 + 1;
      UVar6 = 0;
    }
    else {
      UA_ReferenceNode_deleteMembers(pUVar7 + sVar4);
    }
  }
  return UVar6;
}

Assistant:

static UA_StatusCode
addOneWayReference(UA_Server *server, UA_Session *session,
                   UA_Node *node, const UA_AddReferencesItem *item) {
    size_t i = node->referencesSize;
    size_t refssize = (i+1) | 3; // so the realloc is not necessary every time
    UA_ReferenceNode *new_refs = UA_realloc(node->references, sizeof(UA_ReferenceNode) * refssize);
    if(!new_refs)
        return UA_STATUSCODE_BADOUTOFMEMORY;
    node->references = new_refs;
    UA_ReferenceNode_init(&new_refs[i]);
    UA_StatusCode retval = UA_NodeId_copy(&item->referenceTypeId, &new_refs[i].referenceTypeId);
    retval |= UA_ExpandedNodeId_copy(&item->targetNodeId, &new_refs[i].targetId);
    new_refs[i].isInverse = !item->isForward;
    if(retval == UA_STATUSCODE_GOOD)
        node->referencesSize = i+1;
    else
        UA_ReferenceNode_deleteMembers(&new_refs[i]);
    return retval;
}